

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageFree(HelicsMessage message)

{
  if (((message != (HelicsMessage)0x0) && (*(short *)((long)message + 10) == 0xb3)) &&
     (*(MessageHolder **)((long)message + 0xf8) != (MessageHolder *)0x0)) {
    helics::MessageHolder::freeMessage
              (*(MessageHolder **)((long)message + 0xf8),*(int *)((long)message + 0xf0));
    return;
  }
  return;
}

Assistant:

void helicsMessageFree(HelicsMessage message)
{
    auto* mess = getMessageObj(message, nullptr);
    if (mess == nullptr) {
        return;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages == nullptr) {
        return;
    }
    messages->freeMessage(mess->counter);
}